

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::showSystemMenu(QMdiSubWindow *this)

{
  long lVar1;
  LayoutDirection LVar2;
  int iVar3;
  QWidget *this_00;
  QPoint QVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QPoint local_38;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x308) == 0) || (*(int *)(*(long *)(lVar1 + 0x308) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x310) == 0)) goto LAB_00457be8;
  local_30.xp.m_i = 0;
  local_30.yp.m_i = 0;
  this_00 = maximizedSystemMenuIconWidget(this);
  LVar2 = QWidget::layoutDirection(&this->super_QWidget);
  if (this_00 == (QWidget *)0x0) {
    if (LVar2 == LeftToRight) {
      QVar5 = QWidget::contentsRect(&this->super_QWidget);
      local_38 = QVar5._0_8_;
      this_00 = &this->super_QWidget;
      goto LAB_00457b99;
    }
    QVar5 = QWidget::contentsRect(&this->super_QWidget);
    local_38 = (QPoint)(QVar5._8_8_ & 0xffffffff | QVar5._0_8_ & 0xffffffff00000000);
    QVar4 = QWidget::mapToGlobal(&this->super_QWidget,&local_38);
    local_30 = (QPoint)((ulong)(QVar4.xp.m_i.m_i + 1) | (ulong)QVar4 & 0xffffffff00000000);
  }
  else {
    if (LVar2 == LeftToRight) {
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
      local_38.xp.m_i = 0;
    }
    else {
      local_38.xp.m_i = ((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1;
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
    }
    local_38.yp.m_i = iVar3 + 1;
LAB_00457b99:
    local_30 = QWidget::mapToGlobal(this_00,&local_38);
  }
  LVar2 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar2 == RightToLeft) {
    iVar3 = (**(code **)(**(long **)(lVar1 + 0x310) + 0x70))();
    local_30.xp.m_i = local_30.xp.m_i - iVar3;
  }
  QMenu::popup(*(QMenu **)(lVar1 + 0x310),&local_30,(QAction *)0x0);
LAB_00457be8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::showSystemMenu()
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu)
        return;

    QPoint globalPopupPos;
    if (QWidget *icon = maximizedSystemMenuIconWidget()) {
        if (isLeftToRight())
            globalPopupPos = icon->mapToGlobal(QPoint(0, icon->y() + icon->height()));
        else
            globalPopupPos = icon->mapToGlobal(QPoint(icon->width(), icon->y() + icon->height()));
    } else {
        if (isLeftToRight())
            globalPopupPos = mapToGlobal(contentsRect().topLeft());
        else // + QPoint(1, 0) because topRight() == QPoint(left() + width() -1, top())
            globalPopupPos = mapToGlobal(contentsRect().topRight()) + QPoint(1, 0);
    }

    // Adjust x() with -menuwidth in reverse mode.
    if (isRightToLeft())
        globalPopupPos -= QPoint(d->systemMenu->sizeHint().width(), 0);
    d->systemMenu->popup(globalPopupPos);
}